

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_Respawn(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  AActor *this;
  VMValue *pVVar1;
  AActor *pAVar2;
  ActorFlags *other;
  ActorFlags3 *other_00;
  ActorFlags4 *other_01;
  bool bVar3;
  bool local_10f;
  Self local_10c;
  DVector3 local_108;
  Self local_ec;
  TFlags<ActorFlag7,_unsigned_int> local_e8;
  TFlags<ActorFlag6,_unsigned_int> local_e4;
  TFlags<ActorFlag5,_unsigned_int> local_e0;
  TFlags<ActorFlag4,_unsigned_int> local_dc;
  undefined1 local_d8 [4];
  TFlags<ActorFlag4,_unsigned_int> local_d4;
  TFlags<ActorFlag4,_unsigned_int> local_d0;
  undefined1 local_cc [4];
  TFlags<ActorFlag3,_unsigned_int> local_c8;
  undefined1 local_c4 [4];
  TFlags<ActorFlag3,_unsigned_int> local_c0;
  TFlags<ActorFlag3,_unsigned_int> local_bc;
  TFlags<ActorFlag3,_unsigned_int> local_b8;
  TFlags<ActorFlag2,_unsigned_int> local_b4;
  TFlags<ActorFlag,_unsigned_int> local_b0;
  undefined1 local_ac [4];
  TFlags<ActorFlag,_unsigned_int> local_a8;
  TFlags<ActorFlag,_unsigned_int> local_a4;
  AActor *local_a0;
  AActor *defs;
  TVector2<double> local_80;
  DVector3 local_70;
  undefined1 local_58 [8];
  DVector3 pos;
  bool oktorespawn;
  int flags;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xef3,
                  "int AF_AActor_A_Respawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    this = *(AActor **)&param->field_0;
    local_10f = true;
    if (this != (AActor *)0x0) {
      local_10f = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_10f != false) {
      if (numparam < 2) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xef4,
                        "int AF_AActor_A_Respawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        pos.Z._4_4_ = (pVVar1->field_0).i;
      }
      else {
        if (param[1].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xef4,
                        "int AF_AActor_A_Respawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pos.Z._4_4_ = param[1].field_0.i;
      }
      pos.Z._3_1_ = 0;
      AActor::Pos((DVector3 *)local_58,this);
      TFlags<ActorFlag,_unsigned_int>::operator|=(&this->flags,MF_SOLID);
      pAVar2 = AActor::GetDefault(this);
      this->Height = pAVar2->Height;
      pAVar2 = AActor::GetDefault(this);
      this->radius = pAVar2->radius;
      AActor::RestoreSpecialPosition(this);
      if ((pos.Z._4_4_ & 4) == 0) {
        AActor::Pos((DVector3 *)&defs,this);
        TVector2<double>::TVector2(&local_80,(TVector3<double> *)&defs);
        pos.Z._3_1_ = P_CheckPosition(this,&local_80,true);
      }
      else {
        AActor::Pos(&local_70,this);
        pos.Z._3_1_ = P_TeleportMove(this,&local_70,true,false);
      }
      if ((bool)pos.Z._3_1_ == false) {
        operator~((EnumType)&local_10c);
        TFlags<ActorFlag,_unsigned_int>::operator&=(&this->flags,&local_10c);
      }
      else {
        local_a0 = AActor::GetDefault(this);
        this->health = local_a0->health;
        if ((pos.Z._4_4_ & 2) == 0) {
          TObjPtr<AActor>::operator=(&this->target,(AActor *)0x0);
          TObjPtr<AActor>::operator=(&this->LastHeard,(AActor *)0x0);
          TObjPtr<AActor>::operator=(&this->lastenemy,(AActor *)0x0);
        }
        else {
          bVar3 = TObjPtr<AActor>::operator==(&this->target,this);
          if (bVar3) {
            TObjPtr<AActor>::operator=(&this->target,(AActor *)0x0);
          }
          bVar3 = TObjPtr<AActor>::operator==(&this->lastenemy,this);
          if (bVar3) {
            TObjPtr<AActor>::operator=(&this->lastenemy,(AActor *)0x0);
          }
        }
        other = &local_a0->flags;
        operator~((EnumType)local_ac);
        TFlags<ActorFlag,_unsigned_int>::operator&(&local_a8,other);
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_b0,
                   (int)this +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        TFlags<ActorFlag,_unsigned_int>::operator|(&local_a4,&local_a8);
        TFlags<ActorFlag,_unsigned_int>::operator=(&this->flags,&local_a4);
        TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_b4,&local_a0->flags2);
        TFlags<ActorFlag2,_unsigned_int>::operator=(&this->flags2,&local_b4);
        other_00 = &local_a0->flags3;
        operator|((EnumType)local_c4,MF3_NOSIGHTCHECK);
        TFlags<ActorFlag3,_unsigned_int>::operator~(&local_c0);
        TFlags<ActorFlag3,_unsigned_int>::operator&(&local_bc,other_00);
        operator|((EnumType)local_cc,MF3_NOSIGHTCHECK);
        TFlags<ActorFlag3,_unsigned_int>::operator&(&local_c8,&this->flags3);
        TFlags<ActorFlag3,_unsigned_int>::operator|(&local_b8,&local_bc);
        TFlags<ActorFlag3,_unsigned_int>::operator=(&this->flags3,&local_b8);
        other_01 = &local_a0->flags4;
        operator~((EnumType)local_d8);
        TFlags<ActorFlag4,_unsigned_int>::operator&(&local_d4,other_01);
        TFlags<ActorFlag4,_unsigned_int>::operator&
                  (&local_dc,
                   (int)this + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
                  );
        TFlags<ActorFlag4,_unsigned_int>::operator|(&local_d0,&local_d4);
        TFlags<ActorFlag4,_unsigned_int>::operator=(&this->flags4,&local_d0);
        TFlags<ActorFlag5,_unsigned_int>::TFlags(&local_e0,&local_a0->flags5);
        TFlags<ActorFlag5,_unsigned_int>::operator=(&this->flags5,&local_e0);
        TFlags<ActorFlag6,_unsigned_int>::TFlags(&local_e4,&local_a0->flags6);
        TFlags<ActorFlag6,_unsigned_int>::operator=(&this->flags6,&local_e4);
        TFlags<ActorFlag7,_unsigned_int>::TFlags(&local_e8,&local_a0->flags7);
        TFlags<ActorFlag7,_unsigned_int>::operator=(&this->flags7,&local_e8);
        AActor::SetState(this,this->SpawnState,false);
        operator~((EnumType)&local_ec);
        TFlags<ActorRenderFlag,_unsigned_int>::operator&=(&this->renderflags,&local_ec);
        if ((pos.Z._4_4_ & 1) != 0) {
          P_SpawnTeleportFog(this,(DVector3 *)local_58,true,true);
          AActor::Pos(&local_108,this);
          P_SpawnTeleportFog(this,&local_108,false,true);
        }
        bVar3 = AActor::CountsAsKill(this);
        if (bVar3) {
          level.total_monsters = level.total_monsters + 1;
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xef3,
                  "int AF_AActor_A_Respawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xef3,"int AF_AActor_A_Respawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Respawn)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags);

	bool oktorespawn = false;
	DVector3 pos = self->Pos();

	self->flags |= MF_SOLID;
	self->Height = self->GetDefault()->Height;
	self->radius = self->GetDefault()->radius;
	self->RestoreSpecialPosition();

	if (flags & RSF_TELEFRAG)
	{
		// [KS] DIE DIE DIE DIE erm *ahem* =)
		oktorespawn = P_TeleportMove(self, self->Pos(), true, false);
	}
	else
	{
		oktorespawn = P_CheckPosition(self, self->Pos(), true);
	}

	if (oktorespawn)
	{
		AActor *defs = self->GetDefault();
		self->health = defs->health;

		// [KS] Don't keep target, because it could be self if the monster committed suicide
		//      ...Actually it's better off an option, so you have better control over monster behavior.
		if (!(flags & RSF_KEEPTARGET))
		{
			self->target = NULL;
			self->LastHeard = NULL;
			self->lastenemy = NULL;
		}
		else
		{
			// Don't attack yourself (Re: "Marine targets itself after suicide")
			if (self->target == self)
				self->target = NULL;
			if (self->lastenemy == self)
				self->lastenemy = NULL;
		}

		self->flags  = (defs->flags & ~MF_FRIENDLY) | (self->flags & MF_FRIENDLY);
		self->flags2 = defs->flags2;
		self->flags3 = (defs->flags3 & ~(MF3_NOSIGHTCHECK | MF3_HUNTPLAYERS)) | (self->flags3 & (MF3_NOSIGHTCHECK | MF3_HUNTPLAYERS));
		self->flags4 = (defs->flags4 & ~MF4_NOHATEPLAYERS) | (self->flags4 & MF4_NOHATEPLAYERS);
		self->flags5 = defs->flags5;
		self->flags6 = defs->flags6;
		self->flags7 = defs->flags7;
		self->SetState (self->SpawnState);
		self->renderflags &= ~RF_INVISIBLE;

		if (flags & RSF_FOG)
		{
			P_SpawnTeleportFog(self, pos, true, true);
			P_SpawnTeleportFog(self, self->Pos(), false, true);
		}
		if (self->CountsAsKill())
		{
			level.total_monsters++;
		}
	}
	else
	{
		self->flags &= ~MF_SOLID;
	}
	return 0;
}